

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::ClearFreeMemory(ImDrawListSplitter *this)

{
  undefined8 *puVar1;
  ImDrawChannel *pIVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  iVar4 = (this->_Channels).Size;
  if (0 < iVar4) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (uVar6 == (uint)this->_Current) {
        pIVar2 = (this->_Channels).Data;
        puVar1 = (undefined8 *)((long)&(pIVar2->_IdxBuffer).Size + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&(pIVar2->_CmdBuffer).Size + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        iVar4 = (this->_Channels).Size;
      }
      lVar5 = (long)iVar4;
      if (lVar5 <= (long)uVar6) {
LAB_0032ef5f:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/include/imgui.h"
                      ,0x4e0,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar2 = (this->_Channels).Data;
      pvVar3 = *(void **)((long)&(pIVar2->_CmdBuffer).Data + lVar7);
      if (pvVar3 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar2->_CmdBuffer).Size + lVar7) = 0;
        ImGui::MemFree(pvVar3);
        *(undefined8 *)((long)&(pIVar2->_CmdBuffer).Data + lVar7) = 0;
        iVar4 = (this->_Channels).Size;
        lVar5 = (long)iVar4;
      }
      if (lVar5 <= (long)uVar6) goto LAB_0032ef5f;
      pIVar2 = (this->_Channels).Data;
      pvVar3 = *(void **)((long)&(pIVar2->_IdxBuffer).Data + lVar7);
      if (pvVar3 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar2->_IdxBuffer).Size + lVar7) = 0;
        ImGui::MemFree(pvVar3);
        *(undefined8 *)((long)&(pIVar2->_IdxBuffer).Data + lVar7) = 0;
        iVar4 = (this->_Channels).Size;
        lVar5 = (long)iVar4;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x20;
    } while ((long)uVar6 < lVar5);
  }
  this->_Current = 0;
  this->_Count = 1;
  pIVar2 = (this->_Channels).Data;
  if (pIVar2 != (ImDrawChannel *)0x0) {
    (this->_Channels).Size = 0;
    (this->_Channels).Capacity = 0;
    ImGui::MemFree(pIVar2);
    (this->_Channels).Data = (ImDrawChannel *)0x0;
  }
  return;
}

Assistant:

void ImDrawListSplitter::ClearFreeMemory()
{
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == _Current)
            memset(&_Channels[i], 0, sizeof(_Channels[i]));  // Current channel is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i]._CmdBuffer.clear();
        _Channels[i]._IdxBuffer.clear();
    }
    _Current = 0;
    _Count = 1;
    _Channels.clear();
}